

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrROR0x66(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  uint16_t addr;
  
  addr = zeropage_addr_j(this);
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,addr);
  uVar1 = ROR(this,uVar1);
  Memory::Write8(this_00,addr,uVar1);
  return 5;
}

Assistant:

int CPU::instrROR0x66() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, ROR(m->Read8(address)));
	return 5;
}